

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.cpp
# Opt level: O2

string_view __thiscall slang::ast::Definition::getKindString(Definition *this)

{
  DefinitionKind DVar1;
  logic_error *this_00;
  char *pcVar2;
  string_view sVar3;
  size_t sStack_f0;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  DVar1 = this->definitionKind;
  if (DVar1 == Module) {
    pcVar2 = "module";
    sStack_f0 = 6;
  }
  else if (DVar1 == Program) {
    pcVar2 = "program";
    sStack_f0 = 7;
  }
  else {
    if (DVar1 != Interface) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Definition.cpp"
                 ,&local_d9);
      std::operator+(&local_98,&local_b8,":");
      std::__cxx11::to_string(&local_d8,0x9f);
      std::operator+(&local_78,&local_98,&local_d8);
      std::operator+(&local_58,&local_78,": ");
      std::operator+(&local_38,&local_58,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pcVar2 = "interface";
    sStack_f0 = 9;
  }
  sVar3._M_str = pcVar2;
  sVar3._M_len = sStack_f0;
  return sVar3;
}

Assistant:

string_view Definition::getKindString() const {
    switch (definitionKind) {
        case DefinitionKind::Module:
            return "module"sv;
        case DefinitionKind::Interface:
            return "interface"sv;
        case DefinitionKind::Program:
            return "program"sv;
        default:
            ASSUME_UNREACHABLE;
    }
}